

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::bindBuffer(CaptureVertexSeparate *this)

{
  BindBufferCase in_ESI;
  
  bindBuffer((CaptureVertexSeparate *)
             ((long)&this->_vptr_CaptureVertexSeparate +
             (long)this->_vptr_CaptureVertexSeparate[-0xd]),in_ESI);
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::bindBuffer(BindBufferCase bind_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (bind_case)
	{
	case BIND_BUFFER_BASE_CASE:
		for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs; ++i)
		{
			gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_buffers[i]);
		}
		break;
	case BIND_BUFFER_RANGE_CASE:
		for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs; ++i)
		{
			gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_buffers[i], 0, m_buffer_size);
		}
		break;
	case BIND_BUFFER_OFFSET_CASE:
		for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs; ++i)
		{
			m_glBindBufferOffsetEXT(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffers[i], 0);
		}
		break;
	default:
		throw 0;
	}
}